

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O1

int pcre2_substring_length_byname_16
              (pcre2_match_data_16 *match_data,PCRE2_SPTR16 stringname,size_t *sizeptr)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ushort *puVar7;
  PCRE2_SPTR16 last;
  PCRE2_SPTR16 first;
  ushort *local_40;
  ushort *local_38;
  
  uVar5 = 0xffffffd7;
  if ((match_data->matchedby != 1) &&
     (uVar3 = pcre2_substring_nametable_scan_16(match_data->code,stringname,&local_38,&local_40),
     uVar5 = uVar3, -1 < (int)uVar3)) {
    uVar4 = 0xffffffca;
    uVar5 = 0xffffffca;
    if (local_38 <= local_40) {
      uVar6 = (ulong)uVar3;
      puVar7 = local_38;
      do {
        uVar1 = *puVar7;
        bVar2 = true;
        if (uVar1 < match_data->oveccount) {
          if (match_data->ovector[(ulong)uVar1 * 2] == 0xffffffffffffffff) {
            uVar4 = 0xffffffc9;
          }
          else {
            uVar3 = pcre2_substring_length_bynumber_16(match_data,(uint)uVar1,sizeptr);
            bVar2 = false;
          }
        }
        uVar5 = uVar3;
      } while ((bVar2) && (puVar7 = puVar7 + uVar6, uVar5 = uVar4, puVar7 <= local_40));
    }
  }
  return uVar5;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_length_byname(pcre2_match_data *match_data,
  PCRE2_SPTR stringname, PCRE2_SIZE *sizeptr)
{
PCRE2_SPTR first, last, entry;
int failrc, entrysize;
if (match_data->matchedby == PCRE2_MATCHEDBY_DFA_INTERPRETER)
  return PCRE2_ERROR_DFA_UFUNC;
entrysize = pcre2_substring_nametable_scan(match_data->code, stringname,
  &first, &last);
if (entrysize < 0) return entrysize;
failrc = PCRE2_ERROR_UNAVAILABLE;
for (entry = first; entry <= last; entry += entrysize)
  {
  uint32_t n = GET2(entry, 0);
  if (n < match_data->oveccount)
    {
    if (match_data->ovector[n*2] != PCRE2_UNSET)
      return pcre2_substring_length_bynumber(match_data, n, sizeptr);
    failrc = PCRE2_ERROR_UNSET;
    }
  }
return failrc;
}